

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

uint64_t kfold_int64arith(uint64_t k1,uint64_t k2,IROp op)

{
  IROp op_local;
  uint64_t k2_local;
  uint64_t k1_local;
  
  k1_local = k1;
  switch(op) {
  case IR_BAND:
    k1_local = k2 & k1;
    break;
  case IR_BOR:
    k1_local = k2 | k1;
    break;
  case IR_BXOR:
    k1_local = k2 ^ k1;
    break;
  case IR_ADD:
    k1_local = k2 + k1;
    break;
  case IR_SUB:
    k1_local = k1 - k2;
    break;
  case IR_MUL:
    k1_local = k2 * k1;
  }
  return k1_local;
}

Assistant:

static uint64_t kfold_int64arith(uint64_t k1, uint64_t k2, IROp op)
{
  switch (op) {
#if LJ_64 || LJ_HASFFI
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
#endif
#if LJ_HASFFI
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
#endif
  default: UNUSED(k2); lua_assert(0); break;
  }
  return k1;
}